

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O1

JSValue js_object_toString(JSContext *ctx,JSValue this_val,int argc,JSValue *argv)

{
  ushort uVar1;
  undefined1 auVar2 [16];
  int iVar3;
  JSValueUnion JVar4;
  size_t buf_len;
  JSAtom atom;
  char *buf;
  ulong uVar5;
  JSValue JVar6;
  JSValue val;
  
  if ((int)this_val.tag == 3) {
    buf = "Undefined";
    buf_len = 9;
  }
  else {
    if ((int)this_val.tag != 2) {
      val = JS_ToObject(ctx,this_val);
      JVar4 = val.u;
      if ((uint)val.tag == 6) {
        return val;
      }
      iVar3 = JS_IsArray(ctx,val);
      if (iVar3 < 0) {
        JS_FreeValue(ctx,val);
        uVar5 = 6;
LAB_00163658:
        auVar2._8_8_ = 0;
        auVar2._0_8_ = uVar5;
        return (JSValue)(auVar2 << 0x40);
      }
      atom = 0x90;
      if (iVar3 == 0) {
        iVar3 = JS_IsFunction(ctx,val);
        atom = 0x9a;
        if (iVar3 == 0) {
          uVar1 = *(ushort *)((long)JVar4.ptr + 6);
          atom = 0x8f;
          if ((uVar1 < 0x13) && ((0x40778U >> (uVar1 & 0x1f) & 1) != 0)) {
            atom = ctx->rt->class_array[uVar1].class_name;
          }
        }
      }
      JVar6 = JS_GetPropertyInternal(ctx,val,0xcc,val,0);
      if ((0xfffffff4 < (uint)val.tag) &&
         (iVar3 = *JVar4.ptr, *(int *)JVar4.ptr = iVar3 + -1, iVar3 < 2)) {
        __JS_FreeValueRT(ctx->rt,val);
      }
      if ((int)JVar6.tag != -7) {
        if ((int)JVar6.tag == 6) {
          uVar5 = JVar6.tag & 0xffffffff;
          goto LAB_00163658;
        }
        JS_FreeValue(ctx,JVar6);
        JVar6 = __JS_AtomToValue(ctx,atom,1);
      }
      goto LAB_0016352b;
    }
    buf = "Null";
    buf_len = 4;
  }
  JVar6 = JS_NewStringLen(ctx,buf,buf_len);
LAB_0016352b:
  JVar6 = JS_ConcatString3(ctx,"[object ",JVar6,"]");
  return JVar6;
}

Assistant:

static JSValue js_object_toString(JSContext *ctx, JSValueConst this_val,
                                  int argc, JSValueConst *argv)
{
    JSValue obj, tag;
    int is_array;
    JSAtom atom;
    JSObject *p;

    if (JS_IsNull(this_val)) {
        tag = JS_NewString(ctx, "Null");
    } else if (JS_IsUndefined(this_val)) {
        tag = JS_NewString(ctx, "Undefined");
    } else {
        obj = JS_ToObject(ctx, this_val);
        if (JS_IsException(obj))
            return obj;
        is_array = JS_IsArray(ctx, obj);
        if (is_array < 0) {
            JS_FreeValue(ctx, obj);
            return JS_EXCEPTION;
        }
        if (is_array) {
            atom = JS_ATOM_Array;
        } else if (JS_IsFunction(ctx, obj)) {
            atom = JS_ATOM_Function;
        } else {
            p = JS_VALUE_GET_OBJ(obj);
            switch(p->class_id) {
            case JS_CLASS_STRING:
            case JS_CLASS_ARGUMENTS:
            case JS_CLASS_MAPPED_ARGUMENTS:
            case JS_CLASS_ERROR:
            case JS_CLASS_BOOLEAN:
            case JS_CLASS_NUMBER:
            case JS_CLASS_DATE:
            case JS_CLASS_REGEXP:
                atom = ctx->rt->class_array[p->class_id].class_name;
                break;
            default:
                atom = JS_ATOM_Object;
                break;
            }
        }
        tag = JS_GetProperty(ctx, obj, JS_ATOM_Symbol_toStringTag);
        JS_FreeValue(ctx, obj);
        if (JS_IsException(tag))
            return JS_EXCEPTION;
        if (!JS_IsString(tag)) {
            JS_FreeValue(ctx, tag);
            tag = JS_AtomToString(ctx, atom);
        }
    }
    return JS_ConcatString3(ctx, "[object ", tag, "]");
}